

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O0

int lconnect(lua_State *L)

{
  channel *c_00;
  channel *c;
  lua_State *L_local;
  
  c_00 = (channel *)lua_touserdata(L,1);
  if (c_00 == (channel *)0x0) {
    L_local._4_4_ = luaL_error(L,"Invalid channel pointer");
  }
  else {
    new_channel(L,c_00);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
lconnect(lua_State *L) {
	const char * addr = luaL_checkstring(L, 1);
	int port = luaL_checkinteger(L, 2);
	int fd = socket(AF_INET,SOCK_STREAM,0);
	struct sockaddr_in my_addr;

	my_addr.sin_addr.s_addr=inet_addr(addr);
	my_addr.sin_family=AF_INET;
	my_addr.sin_port=htons(port);

	int r = connect(fd,(struct sockaddr *)&my_addr,sizeof(struct sockaddr_in));

	if (r == -1) {
		return luaL_error(L, "Connect %s %d failed", addr, port);
	}

	int flag = fcntl(fd, F_GETFL, 0);
	fcntl(fd, F_SETFL, flag | O_NONBLOCK);

	lua_pushinteger(L, fd);

	return 1;
}